

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaEsop.c
# Opt level: O2

int Eso_ManFindDistOneLitEqual(int *pCube1,int *pCube2,int nLits)

{
  int iVar1;
  int iVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  
  uVar5 = 0;
  uVar4 = (ulong)(uint)nLits;
  if (nLits < 1) {
    uVar4 = uVar5;
  }
  uVar3 = 0xffffffff;
  do {
    if (uVar4 == uVar5) {
      return (int)uVar3;
    }
    if (pCube1[uVar5] != pCube2[uVar5]) {
      if ((int)uVar3 != -1) {
        return -1;
      }
      iVar1 = Abc_Lit2Var(pCube1[uVar5]);
      iVar2 = Abc_Lit2Var(pCube2[uVar5]);
      if (iVar1 != iVar2) {
        return -1;
      }
      uVar3 = uVar5 & 0xffffffff;
    }
    uVar5 = uVar5 + 1;
  } while( true );
}

Assistant:

int Eso_ManFindDistOneLitEqual( int * pCube1, int * pCube2, int nLits ) // pCube1 and pCube2 both have nLits
{
    int i, iDiff = -1;
    for ( i = 0; i < nLits; i++ )
        if ( pCube1[i] != pCube2[i] )
        {
            if ( iDiff != -1 )
                return -1;
            if ( Abc_Lit2Var(pCube1[i]) != Abc_Lit2Var(pCube2[i]) )
                return -1;
            iDiff = i;
        }
    return iDiff;
}